

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

int make_rgb_colormap(png_image_read_control *display)

{
  undefined4 local_20;
  undefined4 local_1c;
  uint b;
  uint g;
  uint r;
  uint i;
  png_image_read_control *display_local;
  
  g = 0;
  for (b = 0; b < 6; b = b + 1) {
    for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
        png_create_colormap_entry(display,g,b * 0x33,local_1c * 0x33,local_20 * 0x33,0xff,1);
        g = g + 1;
      }
    }
  }
  return g;
}

Assistant:

static int
make_rgb_colormap(png_image_read_control *display)
{
   unsigned int i, r;

   /* Build a 6x6x6 opaque RGB cube */
   for (i=r=0; r<6; ++r)
   {
      unsigned int g;

      for (g=0; g<6; ++g)
      {
         unsigned int b;

         for (b=0; b<6; ++b)
            png_create_colormap_entry(display, i++, r*51, g*51, b*51, 255,
                P_sRGB);
      }
   }

   return (int)i;
}